

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForInObjectEnumerator.cpp
# Opt level: O2

BOOL __thiscall
Js::ForInObjectEnumerator::InitializeCurrentEnumerator
          (ForInObjectEnumerator *this,RecyclableObject *object,EnumeratorCache *forInCache)

{
  BOOL BVar1;
  RecyclableObject *pRVar2;
  Type flags;
  
  flags = (this->enumerator).propertyEnumerator.flags;
  pRVar2 = RecyclableObject::GetPrototype(object);
  if ((pRVar2 == (RecyclableObject *)0x0) || (((pRVar2->type).ptr)->typeId == TypeIds_Null)) {
    flags = flags & ~EnumNonEnumerable;
  }
  BVar1 = InitializeCurrentEnumerator
                    (this,object,flags,(this->enumerator).propertyEnumerator.scriptContext.ptr,
                     forInCache);
  return BVar1;
}

Assistant:

BOOL ForInObjectEnumerator::InitializeCurrentEnumerator(RecyclableObject * object, EnumeratorCache * forInCache)
    {
        EnumeratorFlags flags = enumerator.GetFlags();
        RecyclableObject * prototype = object->GetPrototype();
        if (prototype == nullptr || prototype->GetTypeId() == TypeIds_Null)
        {
            // If this is the last object on the prototype chain, we don't need to get the non-enumerable properties any more to track shadowing
            flags &= ~EnumeratorFlags::EnumNonEnumerable;
        }
        return InitializeCurrentEnumerator(object, flags, GetScriptContext(), forInCache);
    }